

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdistancefield.cpp
# Opt level: O2

void __thiscall
QDistanceField::setGlyph
          (QDistanceField *this,QFontEngine *fontEngine,glyph_t glyph,bool doubleResolution)

{
  glyph_t gVar1;
  QDistanceFieldData *pQVar2;
  long in_FS_OFFSET;
  QRectF local_88;
  QPointF local_68;
  QPainterPath path;
  undefined8 local_44;
  glyph_t glyph_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_44 = 0;
  path.d_ptr.d.ptr = (QExplicitlySharedDataPointer<QPainterPathPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  glyph_local = glyph;
  QPainterPath::QPainterPath(&path);
  (*fontEngine->_vptr_QFontEngine[0xf])(fontEngine,&glyph_local,&local_44,1,&path,0);
  QPainterPath::boundingRect(&local_88,&path);
  local_68.xp._4_4_ = local_88.xp._4_4_ ^ 0x80000000;
  local_68.yp._4_4_ = local_88.yp._4_4_ ^ 0x80000000;
  local_68.xp._0_4_ = local_88.xp._0_4_;
  local_68.yp._0_4_ = local_88.yp._0_4_;
  QPainterPath::translate(&path,&local_68);
  QPainterPath::setFillRule(&path,WindingFill);
  pQVar2 = QDistanceFieldData::create(&path,doubleResolution);
  QSharedDataPointer<QDistanceFieldData>::reset(&this->d,pQVar2);
  gVar1 = glyph_local;
  pQVar2 = QSharedDataPointer<QDistanceFieldData>::operator->(&this->d);
  pQVar2->glyph = gVar1;
  QPainterPath::~QPainterPath(&path);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDistanceField::setGlyph(QFontEngine *fontEngine, glyph_t glyph, bool doubleResolution)
{
    QFixedPoint position;
    QPainterPath path;
    fontEngine->addGlyphsToPath(&glyph, &position, 1, &path, { });
    path.translate(-path.boundingRect().topLeft());
    path.setFillRule(Qt::WindingFill);

    d = QDistanceFieldData::create(path, doubleResolution);
    d->glyph = glyph;
}